

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O2

void __thiscall pbrt::RealisticCamera::TestExitPupilBounds(RealisticCamera *this)

{
  Bounds2<float> *pBVar1;
  float fVar2;
  size_t sVar3;
  Bounds2<float> *pBVar4;
  undefined1 auVar5 [16];
  float fVar6;
  undefined1 auVar7 [16];
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  Float FVar14;
  undefined1 auVar15 [16];
  undefined1 auVar18 [56];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar20 [56];
  undefined1 auVar19 [64];
  undefined1 in_ZMM4 [64];
  undefined4 in_XMM6_Da;
  undefined1 in_register_00001384 [12];
  Bounds2<float> BVar21;
  Bounds2<float> local_e8;
  Point2f u2;
  undefined1 local_80 [32];
  MediumHandle local_60;
  Ray testOut;
  undefined1 extraout_var [56];
  
  auVar15 = in_ZMM4._0_16_;
  fVar2 = *(float *)(((this->super_CameraBase).film.
                      super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff) +
                    0x20);
  if (TestExitPupilBounds()::rng == '\0') {
    iVar10 = __cxa_guard_acquire(&TestExitPupilBounds()::rng);
    if (iVar10 != 0) {
      TestExitPupilBounds::rng.state = 0x853c49e6748fea9b;
      TestExitPupilBounds::rng.inc = 0xda3e39cb94b95bdb;
      __cxa_guard_release(&TestExitPupilBounds()::rng);
    }
  }
  fVar12 = RNG::Uniform<float>(&TestExitPupilBounds::rng);
  sVar3 = (this->exitPupilBounds).nStored;
  pBVar4 = (this->exitPupilBounds).ptr;
  iVar10 = (int)sVar3;
  iVar8 = iVar10 + -1;
  fVar12 = fVar2 * fVar12 * 0.5;
  auVar15 = vcvtusi2ss_avx512f(auVar15,sVar3 - 1);
  auVar20 = ZEXT856(auVar15._8_8_);
  auVar15 = ZEXT416((uint)((fVar12 / (fVar2 * 0.5)) * auVar15._0_4_));
  auVar15 = vroundss_avx(auVar15,auVar15,9);
  iVar9 = (int)auVar15._0_4_;
  if (iVar8 < (int)auVar15._0_4_) {
    iVar9 = iVar8;
  }
  iVar8 = iVar9 + 1;
  pBVar1 = pBVar4 + iVar9;
  local_e8 = *pBVar1;
  auVar18 = ZEXT856((ulong)(pBVar1->pMax).super_Tuple2<pbrt::Point2,_float>);
  if (iVar8 < iVar10) {
    BVar21 = Union<float>(&local_e8,pBVar4 + iVar8);
    auVar19._0_8_ = BVar21.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar19._8_56_ = auVar20;
    auVar16._0_8_ = BVar21.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar16._8_56_ = auVar18;
    local_e8 = (Bounds2<float>)vmovlhps_avx(auVar16._0_16_,auVar19._0_16_);
  }
  iVar10 = 1000;
  auVar15._4_8_ = SUB128(ZEXT812(0),4);
  auVar15._0_4_ = fVar12;
  auVar15._12_4_ = 0;
  do {
    do {
      bVar11 = iVar10 == 0;
      iVar10 = iVar10 + -1;
      if (bVar11) {
        fputc(0x2e,_stderr);
        return;
      }
      fVar13 = RNG::Uniform<float>(&TestExitPupilBounds::rng);
      u2.super_Tuple2<pbrt::Point2,_float>.y = RNG::Uniform<float>(&TestExitPupilBounds::rng);
      u2.super_Tuple2<pbrt::Point2,_float>.x = fVar13;
      auVar17._0_8_ = SampleUniformDiskConcentric(&u2);
      auVar17._8_56_ = extraout_var;
      fVar13 = (this->elementInterfaces).ptr[(this->elementInterfaces).nStored - 1].apertureRadius;
      testOut.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      fVar6 = auVar17._0_4_ * fVar13;
      auVar5 = vmovshdup_avx(auVar17._0_16_);
      fVar13 = auVar5._0_4_ * fVar13;
      local_80._0_8_ = vmovlps_avx(auVar15);
      local_80._8_4_ = 0.0;
      local_80._12_16_ = vinsertps_avx(ZEXT416((uint)(fVar6 - fVar12)),ZEXT416((uint)fVar13),0x1c);
      local_60.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )0;
      testOut._16_12_ = SUB1612(ZEXT816(0),0);
      testOut.o.super_Tuple3<pbrt::Point3,_float> =
           (Tuple3<pbrt::Point3,_float>)((undefined1  [12])testOut._16_12_ << 0x20);
      testOut.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      FVar14 = TraceLensesFromFilm(this,(Ray *)local_80,&testOut);
    } while ((FVar14 == 0.0) && (!NAN(FVar14)));
  } while ((local_e8.pMin.super_Tuple2<pbrt::Point2,_float>.x <= fVar6) &&
          (((fVar6 <= local_e8.pMax.super_Tuple2<pbrt::Point2,_float>.x &&
            (local_e8.pMin.super_Tuple2<pbrt::Point2,_float>.y <= fVar13)) &&
           (fVar13 <= local_e8.pMax.super_Tuple2<pbrt::Point2,_float>.y))));
  fprintf(_stderr,"Aha! (%f,%f) went through, but outside bounds (%f,%f) - (%f,%f)\n",(double)fVar6,
          (double)fVar13,(double)local_e8.pMin.super_Tuple2<pbrt::Point2,_float>.x,
          (double)local_e8.pMin.super_Tuple2<pbrt::Point2,_float>.y,
          (double)local_e8.pMax.super_Tuple2<pbrt::Point2,_float>.x,
          (double)local_e8.pMax.super_Tuple2<pbrt::Point2,_float>.y);
  auVar5._4_12_ = in_register_00001384;
  auVar5._0_4_ = in_XMM6_Da;
  auVar15 = vcvtusi2ss_avx512f(auVar5,(this->exitPupilBounds).nStored);
  RenderExitPupil(this,((float)iVar9 / auVar15._0_4_) * fVar2 * 0.5,0.0,"low.exr");
  auVar7._4_12_ = in_register_00001384;
  auVar7._0_4_ = in_XMM6_Da;
  auVar15 = vcvtusi2ss_avx512f(auVar7,(this->exitPupilBounds).nStored);
  RenderExitPupil(this,((float)iVar8 / auVar15._0_4_) * fVar2 * 0.5,0.0,"high.exr");
  RenderExitPupil(this,fVar12,0.0,"mid.exr");
  exit(0);
}

Assistant:

void RealisticCamera::TestExitPupilBounds() const {
    Float filmDiagonal = film.Diagonal();

    static RNG rng;

    Float u = rng.Uniform<Float>();
    Point3f pFilm(u * filmDiagonal / 2, 0, 0);

    Float r = pFilm.x / (filmDiagonal / 2);
    int pupilIndex = std::min<int>(exitPupilBounds.size() - 1,
                                   std::floor(r * (exitPupilBounds.size() - 1)));
    Bounds2f pupilBounds = exitPupilBounds[pupilIndex];
    if (pupilIndex + 1 < (int)exitPupilBounds.size())
        pupilBounds = Union(pupilBounds, exitPupilBounds[pupilIndex + 1]);

    // Now, randomly pick points on the aperture and see if any are outside
    // of pupil bounds...
    for (int i = 0; i < 1000; ++i) {
        Point2f u2{rng.Uniform<Float>(), rng.Uniform<Float>()};
        Point2f pd = SampleUniformDiskConcentric(u2);
        pd *= RearElementRadius();

        Ray testRay(pFilm, Point3f(pd.x, pd.y, 0.f) - pFilm);
        Ray testOut;
        if (!TraceLensesFromFilm(testRay, &testOut))
            continue;

        if (!Inside(pd, pupilBounds)) {
            fprintf(stderr,
                    "Aha! (%f,%f) went through, but outside bounds (%f,%f) - "
                    "(%f,%f)\n",
                    pd.x, pd.y, pupilBounds.pMin[0], pupilBounds.pMin[1],
                    pupilBounds.pMax[0], pupilBounds.pMax[1]);
            RenderExitPupil(
                (Float)pupilIndex / exitPupilBounds.size() * filmDiagonal / 2.f, 0.f,
                "low.exr");
            RenderExitPupil(
                (Float)(pupilIndex + 1) / exitPupilBounds.size() * filmDiagonal / 2.f,
                0.f, "high.exr");
            RenderExitPupil(pFilm.x, 0.f, "mid.exr");
            exit(0);
        }
    }
    fprintf(stderr, ".");
}